

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O2

void test_uintwide_t_n_base::
     get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<96u,unsigned_short,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
               (uintwide_t<24U,_unsigned_char,_void,_false> *u_local,
               number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
               *u_boost,size_t count)

{
  anon_class_32_4_006e9c57 parallel_function;
  enable_if_t<(_false),_uintwide_t<96U,_unsigned_short>_> eVar1;
  enable_if_t<(_false),_uintwide_t<96U,_unsigned_short>_> eVar2;
  uint __res;
  uint uVar3;
  random_engine_type *prVar4;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  atomic_flag rnd_lock;
  atomic_flag local_71;
  uintwide_t<24U,_unsigned_char,_void,_false> **local_70;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  **ppnStack_68;
  undefined8 *local_60;
  atomic_flag *paStack_58;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_50;
  uintwide_t<24U,_unsigned_char,_void,_false> *local_48;
  undefined8 local_40;
  undefined8 local_34;
  
  local_50 = u_boost;
  local_48 = u_local;
  prVar4 = my_random_generator();
  uVar3 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  prVar4->_M_x = uVar3 % 0x7fffffff + (uint)(uVar3 % 0x7fffffff == 0);
  eVar1 = math::wide_integer::uintwide_t<96U,_unsigned_short,_void,_false>::limits_helper_min<false>
                    ();
  eVar2 = math::wide_integer::uintwide_t<96U,_unsigned_short,_void,_false>::limits_helper_max<false>
                    ();
  local_34 = CONCAT53(extraout_var_00,eVar2.values.super_array<unsigned_char,_3UL>.elems);
  local_60 = &local_40;
  paStack_58 = &local_71;
  local_71.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  parallel_function.u_boost = &local_50;
  parallel_function.u_local = &local_48;
  parallel_function.distribution = (distribution_type *)local_60;
  parallel_function.rnd_lock = paStack_58;
  local_70 = &local_48;
  ppnStack_68 = &local_50;
  local_40 = CONCAT53(extraout_var,eVar1.values.super_array<unsigned_char,_3UL>.elems);
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_base::get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<96u,unsigned_short,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>(math::wide_integer::uintwide_t<96u,unsigned_short,void,false>*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,unsigned_long)::_lambda(unsigned_long)_1_>
            (0,count,parallel_function);
  return;
}

Assistant:

static auto get_equal_random_test_values_boost_and_local_n(      OtherLocalUintType* u_local,
                                                                     OtherBoostUintType* u_boost,
                                                               const std::size_t         count) -> void
    {
      using other_local_uint_type = OtherLocalUintType;
      using other_boost_uint_type = OtherBoostUintType;

      my_random_generator().seed(util::util_pseudorandom_time_point_seed::value<typename random_engine_type::result_type>());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using distribution_type =
        WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #else
      using distribution_type =
        ::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #endif

      distribution_type distribution;

      std::atomic_flag rnd_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        count,
        [&u_local, &u_boost, &distribution, &rnd_lock](std::size_t i)
        {
          while(rnd_lock.test_and_set()) { ; }
          const other_local_uint_type a = distribution(my_random_generator());
          rnd_lock.clear();

          u_local[i] = a;                                                // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          u_boost[i] = other_boost_uint_type("0x" + hexlexical_cast(a)); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
        }
      );
    }